

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O2

bool __thiscall cmCTestVC::Update(cmCTestVC *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *extraout_RDX;
  byte bVar5;
  string_view value;
  string versionOverride;
  allocator<char> local_81;
  string local_80;
  string local_60;
  string local_40;
  
  pcVar1 = this->CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"UpdateVersionOverride",(allocator<char> *)&local_60);
  cmCTest::GetCTestConfiguration(&local_40,pcVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (local_40._M_string_length == 0) {
    pcVar1 = this->CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"UpdateVersionOnly",&local_81);
    cmCTest::GetCTestConfiguration(&local_80,pcVar1,&local_60);
    value._M_str = extraout_RDX;
    value._M_len = (size_t)local_80._M_dataplus._M_p;
    bVar2 = cmValue::IsOn((cmValue *)local_80._M_string_length,value);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    bVar5 = 1;
    if (!bVar2) {
      iVar3 = (*this->_vptr_cmCTestVC[3])(this);
      std::operator<<(this->Log,"--- Begin Update ---\n");
      iVar4 = (*this->_vptr_cmCTestVC[4])(this);
      std::operator<<(this->Log,"--- End Update ---\n");
      bVar5 = (byte)iVar3 & (byte)iVar4;
    }
    iVar3 = (*this->_vptr_cmCTestVC[5])(this);
    bVar5 = bVar5 & (byte)iVar3;
  }
  else {
    bVar5 = 1;
    (*this->_vptr_cmCTestVC[6])(this,&local_40);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return (bool)bVar5;
}

Assistant:

bool cmCTestVC::Update()
{
  bool result = true;

  // Use the explicitly specified version.
  std::string versionOverride =
    this->CTest->GetCTestConfiguration("UpdateVersionOverride");
  if (!versionOverride.empty()) {
    this->SetNewRevision(versionOverride);
    return true;
  }

  // if update version only is on then do not actually update,
  // just note the current version and finish
  if (!cmIsOn(this->CTest->GetCTestConfiguration("UpdateVersionOnly"))) {
    result = this->NoteOldRevision() && result;
    this->Log << "--- Begin Update ---\n";
    result = this->UpdateImpl() && result;
    this->Log << "--- End Update ---\n";
  }
  result = this->NoteNewRevision() && result;
  return result;
}